

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_InitCachedScope
              (Var varFunc,PropertyIdArray *propIds,Type *literalType,bool formalsAreLetDecls,
              ScriptContext *scriptContext)

{
  code *pcVar1;
  Type TVar2;
  bool bVar3;
  ThreadContext *threadContext;
  undefined4 *puVar4;
  JavascriptGeneratorFunction *this;
  DynamicType **ppDVar5;
  FunctionBody *this_00;
  JavascriptLibrary *pJVar6;
  Recycler *pRVar7;
  ActivationObjectEx *pAVar8;
  int local_1bc;
  Type local_158;
  Type local_154;
  GeneratorVirtualScriptFunction *local_120;
  bool local_102;
  Type local_f4;
  uint i_1;
  TrackAllocData local_e0;
  ActivationObjectEx *local_b8;
  ActivationObjectEx *tmp;
  ActivationObjectEx *pAStack_a8;
  uint i;
  ActivationObjectEx *scopeObjEx;
  Var undef;
  DynamicType *pDStack_90;
  uint formalsSlotLimit;
  DynamicType *type;
  PropertyId lastFuncSlot;
  PropertyId firstVarSlot;
  PropertyId firstFuncSlot;
  PropertyId cachedFuncCount;
  ScriptFunction *func;
  JavascriptFunction *function;
  bool local_51;
  undefined1 local_50 [7];
  bool isGAFunction;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  bool formalsAreLetDecls_local;
  Type *literalType_local;
  PropertyIdArray *propIds_local;
  Var varFunc_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  local_51 = VarIs<Js::JavascriptFunction>(varFunc);
  if (!local_51) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1741,"(isGAFunction)","isGAFunction");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((local_51 & 1U) != 0) {
    func = (ScriptFunction *)VarTo<Js::JavascriptFunction>(varFunc);
    bVar3 = JavascriptGeneratorFunction::Test((JavascriptFunction *)func);
    local_102 = true;
    if (!bVar3) {
      local_102 = JavascriptAsyncFunction::Test((JavascriptFunction *)func);
    }
    local_51 = local_102;
  }
  if ((local_51 & 1U) == 0) {
    local_120 = (GeneratorVirtualScriptFunction *)VarTo<Js::ScriptFunction>(varFunc);
  }
  else {
    this = VarTo<Js::JavascriptGeneratorFunction>(varFunc);
    local_120 = JavascriptGeneratorFunction::GetGeneratorVirtualScriptFunction(this);
  }
  _firstFuncSlot = local_120;
  *(int *)(reentrancylock._24_8_ + 0x910) = *(int *)(reentrancylock._24_8_ + 0x910) + 1;
  if (*(uint *)(reentrancylock._24_8_ + 0xb1c) < propIds->count) {
    *(Type *)(reentrancylock._24_8_ + 0xb1c) = propIds->count;
  }
  firstVarSlot = ActivationObjectEx::GetCachedFuncCount(propIds);
  lastFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
  type._4_4_ = ActivationObjectEx::GetFirstVarSlot(propIds);
  type._0_4_ = 0xffffffff;
  if (lastFuncSlot != -1) {
    if ((type._4_4_ == 0xffffffff) || (TVar2 = type._4_4_, (int)type._4_4_ < lastFuncSlot)) {
      TVar2 = propIds->count;
    }
    type._0_4_ = TVar2 - 1;
  }
  ppDVar5 = Memory::WriteBarrierPtr::operator_cast_to_DynamicType__((WriteBarrierPtr *)literalType);
  pDStack_90 = *ppDVar5;
  if (pDStack_90 == (DynamicType *)0x0) {
    pJVar6 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    pDStack_90 = JavascriptLibrary::GetActivationObjectType(pJVar6);
    if (formalsAreLetDecls) {
      if (lastFuncSlot == -1) {
        if (type._4_4_ == 0xffffffff) {
          local_158 = propIds->count;
        }
        else {
          local_158 = type._4_4_;
        }
        local_154 = local_158;
      }
      else {
        local_154 = lastFuncSlot;
      }
      undef._4_4_ = local_154;
      this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)_firstFuncSlot);
      bVar3 = FunctionBody::HasReferenceableBuiltInArguments(this_00);
      if (bVar3) {
        pDStack_90 = PathTypeHandlerBase::CreateNewScopeObject<true>
                               ((ScriptContext *)reentrancylock._24_8_,pDStack_90,propIds,'@',
                                undef._4_4_);
      }
      else {
        pDStack_90 = PathTypeHandlerBase::CreateNewScopeObject<false>
                               ((ScriptContext *)reentrancylock._24_8_,pDStack_90,propIds,'@',
                                undef._4_4_);
      }
    }
    else {
      pDStack_90 = PathTypeHandlerBase::CreateNewScopeObject<false>
                             ((ScriptContext *)reentrancylock._24_8_,pDStack_90,propIds,'\0',
                              0xffffffff);
    }
    Memory::WriteBarrierPtr<Js::DynamicType>::operator=(literalType,pDStack_90);
  }
  else {
    *(int *)(reentrancylock._24_8_ + 0xb24) = *(int *)(reentrancylock._24_8_ + 0xb24) + 1;
  }
  pJVar6 = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  scopeObjEx = (ActivationObjectEx *)
               JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
  pAStack_a8 = ScriptFunction::GetCachedScope(&_firstFuncSlot->super_ScriptFunction);
  if ((pAStack_a8 == (ActivationObjectEx *)0x0) ||
     (bVar3 = ActivationObjectEx::IsCommitted(pAStack_a8), !bVar3)) {
    pRVar7 = ScriptContext::GetRecycler((ScriptContext *)reentrancylock._24_8_);
    if (firstVarSlot == 0) {
      local_1bc = 0;
    }
    else {
      local_1bc = firstVarSlot + -1;
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_e0,(type_info *)&ActivationObjectEx::typeinfo,(long)local_1bc << 4,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
               ,0x1794);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_e0);
    pAVar8 = (ActivationObjectEx *)new<Memory::Recycler>(0x48,pRVar7,0x446fd0,0);
    ActivationObjectEx::ActivationObjectEx
              (pAVar8,pDStack_90,&_firstFuncSlot->super_ScriptFunction,firstVarSlot,lastFuncSlot,
               (uint)type);
    local_b8 = pAVar8;
    if (pAStack_a8 == (ActivationObjectEx *)0x0) {
      ScriptFunction::SetCachedScope(&_firstFuncSlot->super_ScriptFunction,pAVar8);
    }
    pAStack_a8 = local_b8;
    for (local_f4 = type._4_4_; local_f4 < propIds->count; local_f4 = local_f4 + 1) {
      DynamicObject::SetSlot
                ((DynamicObject *)pAStack_a8,(&propIds[1].count)[local_f4],false,local_f4,scopeObjEx
                );
    }
  }
  else {
    DynamicObject::ReplaceType((DynamicObject *)pAStack_a8,pDStack_90);
    ActivationObjectEx::SetCommit(pAStack_a8,false);
    for (tmp._4_4_ = type._4_4_; tmp._4_4_ < propIds->count; tmp._4_4_ = tmp._4_4_ + 1) {
      pAVar8 = (ActivationObjectEx *)DynamicObject::GetSlot((DynamicObject *)pAStack_a8,tmp._4_4_);
      if (pAVar8 != scopeObjEx) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x178e,"(scopeObjEx->GetSlot(i) == undef)",
                                    "Var attached to cached scope");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  pAVar8 = pAStack_a8;
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return pAVar8;
}

Assistant:

Var JavascriptOperators::OP_InitCachedScope(Var varFunc, const Js::PropertyIdArray *propIds, Field(DynamicType*)* literalType, bool formalsAreLetDecls, ScriptContext *scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_InitCachedScope, reentrancylock, scriptContext->GetThreadContext());
        bool isGAFunction = VarIs<JavascriptFunction>(varFunc);
        Assert(isGAFunction);
        if (isGAFunction)
        {
            JavascriptFunction *function = VarTo<JavascriptFunction>(varFunc);
            isGAFunction = JavascriptGeneratorFunction::Test(function) || JavascriptAsyncFunction::Test(function);
        }

        ScriptFunction *func = isGAFunction ?
            VarTo<JavascriptGeneratorFunction>(varFunc)->GetGeneratorVirtualScriptFunction() :
            VarTo<ScriptFunction>(varFunc);

#ifdef PROFILE_OBJECT_LITERALS
        // Empty objects not counted in the object literal counts
        scriptContext->objectLiteralInstanceCount++;
        if (propIds->count > scriptContext->objectLiteralMaxLength)
        {
            scriptContext->objectLiteralMaxLength = propIds->count;
        }
#endif

        PropertyId cachedFuncCount = ActivationObjectEx::GetCachedFuncCount(propIds);
        PropertyId firstFuncSlot = ActivationObjectEx::GetFirstFuncSlot(propIds);
        PropertyId firstVarSlot = ActivationObjectEx::GetFirstVarSlot(propIds);
        PropertyId lastFuncSlot = Constants::NoProperty;

        if (firstFuncSlot != Constants::NoProperty)
        {
            if (firstVarSlot == Constants::NoProperty || firstVarSlot < firstFuncSlot)
            {
                lastFuncSlot = propIds->count - 1;
            }
            else
            {
                lastFuncSlot = firstVarSlot - 1;
            }
        }

        DynamicType *type = *literalType;
        if (type != nullptr)
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCacheCount++;
#endif
        }
        else
        {
            type = scriptContext->GetLibrary()->GetActivationObjectType();
            if (formalsAreLetDecls)
            {
                uint formalsSlotLimit = (firstFuncSlot != Constants::NoProperty) ? (uint)firstFuncSlot :
                                        (firstVarSlot != Constants::NoProperty) ? (uint)firstVarSlot :
                                        propIds->count;
                if (func->GetFunctionBody()->HasReferenceableBuiltInArguments())
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
                else
                {
                    type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds, PropertyLet, formalsSlotLimit);
                }
            }
            else
            {
                type = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, type, propIds);
            }
            *literalType = type;
        }
        Var undef = scriptContext->GetLibrary()->GetUndefined();

        ActivationObjectEx *scopeObjEx = func->GetCachedScope();
        if (scopeObjEx && scopeObjEx->IsCommitted())
        {
            scopeObjEx->ReplaceType(type);
            scopeObjEx->SetCommit(false);
#if DBG
            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                AssertMsg(scopeObjEx->GetSlot(i) == undef, "Var attached to cached scope");
            }
#endif
        }
        else
        {
            ActivationObjectEx *tmp = RecyclerNewPlus(scriptContext->GetRecycler(), (cachedFuncCount == 0 ? 0 : cachedFuncCount - 1) * sizeof(FuncCacheEntry), ActivationObjectEx, type, func, cachedFuncCount, firstFuncSlot, lastFuncSlot);
            if (!scopeObjEx)
            {
                func->SetCachedScope(tmp);
            }
            scopeObjEx = tmp;

            for (uint i = firstVarSlot; i < propIds->count; i++)
            {
                scopeObjEx->SetSlot(SetSlotArguments(propIds->elements[i], i, undef));
            }
        }

        return scopeObjEx;
        JIT_HELPER_END(OP_InitCachedScope);
    }